

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O3

bool __thiscall Linker::SaveRegVmListing(Linker *this,OutputContext *output,bool withProfileInfo)

{
  byte bVar1;
  uchar rA;
  uchar rB;
  uchar rC;
  RegVmCmd *pRVar2;
  unkuint9 Var3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ExternFuncInfo *pEVar10;
  ExternSourceInfo *pEVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  RegVmInstructionCode code;
  byte *pbVar16;
  byte *pbVar17;
  byte *pbVar18;
  byte bVar19;
  ulong uVar20;
  uint i;
  undefined1 auVar21 [16];
  long lVar22;
  long lVar23;
  uint local_34c;
  uint local_33c;
  ulong local_338;
  byte *local_330;
  ExternSourceInfo *local_328;
  ExternSourceInfo *local_320;
  ulong local_318;
  ExternFuncInfo *local_310;
  double local_308;
  double dStack_300;
  TraceScope traceScope;
  SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> regVmJumpTargetSet;
  SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U> regVmFunctionMap;
  
  if ((SaveRegVmListing(OutputContext&,bool)::token == '\0') &&
     (iVar15 = __cxa_guard_acquire(&SaveRegVmListing(OutputContext&,bool)::token), iVar15 != 0)) {
    SaveRegVmListing::token = NULLC::TraceGetToken("link","SaveRegVmListing");
    __cxa_guard_release(&SaveRegVmListing(OutputContext&,bool)::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,SaveRegVmListing::token);
  if (withProfileInfo) {
    lVar6 = 0;
    lVar22 = 0;
    lVar23 = 0;
    do {
      uVar20 = *(ulong *)((this->exRegVmInstructionExecCount).data + lVar6);
      lVar22 = lVar22 + (uVar20 & 0xffffffff);
      lVar23 = lVar23 + (uVar20 >> 0x20);
      lVar6 = lVar6 + 2;
    } while (lVar6 != 0x100);
    local_338 = lVar23 + lVar22;
  }
  else {
    local_338 = 0;
  }
  local_328 = (this->exRegVmSourceInfo).data;
  uVar13 = (this->exRegVmSourceInfo).count;
  regVmJumpTargetSet.data = regVmJumpTargetSet.storage;
  regVmJumpTargetSet.allocator = (Allocator *)0x0;
  regVmJumpTargetSet.bucketCount = 0x20;
  regVmJumpTargetSet.count = 0;
  NULLC::fillMemory(regVmJumpTargetSet.data,0,0x80);
  if ((this->regVmJumpTargets).count != 0) {
    lVar6 = 0;
    uVar20 = 0;
    do {
      SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::insert
                (&regVmJumpTargetSet,(uint *)((long)(this->regVmJumpTargets).data + lVar6));
      uVar20 = uVar20 + 1;
      lVar6 = lVar6 + 4;
    } while (uVar20 < (this->regVmJumpTargets).count);
  }
  regVmFunctionMap.data = regVmFunctionMap.storage;
  regVmFunctionMap.allocator = (Allocator *)0x0;
  regVmFunctionMap.bucketCount = 0x20;
  regVmFunctionMap.count = 0;
  NULLC::fillMemory(regVmFunctionMap.data,0,0x200);
  if ((this->exFunctions).count != 0) {
    lVar6 = 0;
    uVar20 = 0;
    do {
      pEVar10 = (this->exFunctions).data;
      local_33c = *(uint *)((long)&pEVar10->regVmAddress + lVar6);
      local_310 = (ExternFuncInfo *)((long)&pEVar10->offsetToName + lVar6);
      SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::insert
                (&regVmFunctionMap,&local_33c,&local_310);
      uVar20 = uVar20 + 1;
      lVar6 = lVar6 + 0x94;
    } while (uVar20 < (this->exFunctions).count);
  }
  if ((uVar13 != 0) && ((this->exRegVmCode).count != 0)) {
    uVar13 = uVar13 - 1;
    auVar21._0_8_ = (double)CONCAT44(0x43300000,(int)local_338);
    auVar21._8_4_ = (int)(local_338 >> 0x20);
    auVar21._12_4_ = 0x45300000;
    dStack_300 = auVar21._8_8_ - 1.9342813113834067e+25;
    local_308 = dStack_300 + (auVar21._0_8_ - 4503599627370496.0);
    pbVar18 = (byte *)(this->exSource).data;
    local_320 = local_328 + 1;
    local_34c = 0xffffffff;
    local_330 = (byte *)0x0;
    uVar12 = 0;
    uVar20 = 0;
    do {
      uVar5 = uVar13;
      if (uVar13 < uVar12) {
        uVar5 = uVar12;
      }
      uVar9 = (ulong)uVar12;
      pEVar11 = local_320 + uVar9;
      uVar14 = uVar12 - 1;
      do {
        uVar12 = uVar5;
        if (uVar13 <= uVar9) break;
        uVar9 = uVar9 + 1;
        puVar4 = &pEVar11->instruction;
        uVar12 = uVar14 + 1;
        pEVar11 = pEVar11 + 1;
        uVar14 = uVar12;
      } while (*puVar4 <= uVar20);
      if (uVar12 != local_34c) {
        pbVar16 = (byte *)(this->exSource).data;
        uVar9 = (ulong)local_328[uVar12].sourceOffset;
        do {
          uVar7 = uVar9;
          if (uVar7 == 0) goto LAB_001c9a1e;
          uVar9 = uVar7 - 1;
        } while (pbVar16[uVar7 - 1] != 10);
        pbVar16 = pbVar16 + uVar7;
LAB_001c9a1e:
        uVar5 = (int)pbVar16 - (int)pbVar18;
        for (; (bVar19 = *pbVar16, bVar19 == 9 || (bVar19 == 0x20)); pbVar16 = pbVar16 + 1) {
          uVar5 = uVar5 + 1;
        }
        uVar14 = 0;
        pbVar17 = pbVar16;
        while ((0xd < bVar19 || ((0x2401U >> (bVar19 & 0x1f) & 1) == 0))) {
          bVar19 = pbVar17[1];
          pbVar17 = pbVar17 + 1;
          uVar14 = uVar14 + 1;
          uVar5 = uVar5 + 1;
        }
        local_34c = uVar12;
        if (pbVar18 < pbVar17) {
          OutputContext::Printf(output,"%.*s\r\n",(ulong)uVar5,pbVar18);
          pbVar18 = pbVar17;
        }
        else if (pbVar16 != local_330) {
          OutputContext::Printf(output,"%.*s\r\n",(ulong)uVar14,pbVar16);
          local_330 = pbVar16;
        }
      }
      if ((this->exRegVmCode).count <= uVar20) {
LAB_001c9fe1:
        pcVar8 = 
        "T &FastVector<RegVmCmd>::operator[](unsigned int) [T = RegVmCmd, zeroNewMemory = false, skipConstructor = false]"
        ;
LAB_001c9ff6:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,pcVar8);
      }
      if (regVmJumpTargetSet.bucketCount == 0) {
LAB_001c9b29:
        bVar19 = 0;
      }
      else {
        uVar9 = (ulong)((int)uVar20 * -0x61c88647 & regVmJumpTargetSet.bucketCount - 1);
        if ((ulong)regVmJumpTargetSet.data[uVar9] == 0) goto LAB_001c9b29;
        bVar19 = 1;
        if (uVar20 != regVmJumpTargetSet.data[uVar9]) {
          uVar5 = 1;
          do {
            uVar14 = uVar5;
            uVar5 = uVar14;
            if (regVmJumpTargetSet.bucketCount == uVar14) goto LAB_001c9e57;
            uVar9 = (ulong)((int)uVar9 + uVar14 & regVmJumpTargetSet.bucketCount - 1);
            if ((ulong)regVmJumpTargetSet.data[uVar9] == 0) {
              uVar5 = 0;
              goto LAB_001c9e57;
            }
            uVar5 = uVar14 + 1;
          } while (uVar20 != regVmJumpTargetSet.data[uVar9]);
          uVar5 = 1;
LAB_001c9e57:
          bVar19 = uVar14 < regVmJumpTargetSet.bucketCount & (byte)uVar5;
        }
      }
      pRVar2 = (this->exRegVmCode).data;
      bVar1 = pRVar2[uVar20].code;
      code = (RegVmInstructionCode)bVar1;
      rA = pRVar2[uVar20].rA;
      rB = pRVar2[uVar20].rB;
      rC = pRVar2[uVar20].rC;
      local_318 = (ulong)pRVar2[uVar20].argument;
      if (regVmFunctionMap.bucketCount != 0) {
        uVar14 = (int)uVar20 * -0x61c88647;
        iVar15 = 0;
        uVar5 = regVmFunctionMap.bucketCount;
        do {
          uVar14 = uVar14 & regVmFunctionMap.bucketCount - 1;
          if ((ulong)regVmFunctionMap.data[uVar14].key == 0) break;
          if (uVar20 == regVmFunctionMap.data[uVar14].key) {
            OutputContext::Printf
                      (output,"// %s#%d\n",
                       (this->exSymbols).data + (regVmFunctionMap.data[uVar14].value)->offsetToName,
                       (ulong)(uint)((int)((ulong)((long)regVmFunctionMap.data[uVar14].value -
                                                  (long)(this->exFunctions).data) >> 2) *
                                    -0x6eb3e453));
            break;
          }
          uVar14 = uVar14 + iVar15 + 1;
          iVar15 = iVar15 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      if (withProfileInfo) {
        if (bVar19 == 0) {
          if ((this->exRegVmExecCount).count <= uVar20) goto LAB_001c9fca;
          uVar9 = (ulong)(this->exRegVmExecCount).data[uVar20];
          if (((double)uVar9 / local_308) * 100.0 <= 0.1) {
            OutputContext::Printf(output,"// (%8d     ) %4d ",uVar9,uVar20 & 0xffffffff);
          }
          else {
            OutputContext::Printf(output,"// (%8d %4.1f) %4d ",uVar9,uVar20 & 0xffffffff);
          }
        }
        else {
          OutputContext::Printf(output,"//            %4d:\n",uVar20 & 0xffffffff);
          if ((this->exRegVmExecCount).count <= uVar20) {
LAB_001c9fca:
            pcVar8 = 
            "T &FastVector<unsigned int>::operator[](unsigned int) [T = unsigned int, zeroNewMemory = false, skipConstructor = false]"
            ;
            goto LAB_001c9ff6;
          }
          if (((double)(this->exRegVmExecCount).data[uVar20] / local_308) * 100.0 <= 0.1) {
            OutputContext::Printf(output,"// (%8d     )      ");
          }
          else {
            OutputContext::Printf(output,"// (%8d %4.1f)      ");
          }
        }
      }
      else if (bVar19 == 0) {
        OutputContext::Printf(output,"// %4d ",uVar20 & 0xffffffff);
      }
      else {
        OutputContext::Printf(output,"// %4d:\n",uVar20 & 0xffffffff);
        OutputContext::Printf(output,"//      ");
      }
      PrintInstruction(output,(char *)(this->exRegVmConstants).data,(this->exFunctions).data,
                       (this->exSymbols).data,code,rA,rB,rC,(uint)local_318,(VmConstant *)0x0);
      if (bVar1 == 0x5f) {
LAB_001c9d89:
        if ((this->exRegVmCode).count <= uVar20) goto LAB_001c9fe1;
        uVar5 = (this->exRegVmCode).data[uVar20].argument;
        if ((this->exFunctions).count <= uVar5) {
          pcVar8 = 
          "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
          ;
          goto LAB_001c9ff6;
        }
        pcVar8 = (this->exSymbols).data;
        pEVar10 = (this->exFunctions).data + uVar5;
LAB_001c9e0e:
        OutputContext::Printf(output," (%s)",pcVar8 + pEVar10->offsetToName);
      }
      else {
        if (code == rviConvertPtr) {
          if ((this->exRegVmCode).count <= uVar20) goto LAB_001c9fe1;
          uVar5 = (this->exRegVmCode).data[uVar20].argument;
          if ((this->exTypes).count <= uVar5) {
            pcVar8 = 
            "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
            ;
            goto LAB_001c9ff6;
          }
          pcVar8 = (this->exSymbols).data;
          pEVar10 = (ExternFuncInfo *)((this->exTypes).data + uVar5);
          goto LAB_001c9e0e;
        }
        if (code == rviCall) goto LAB_001c9d89;
      }
      OutputContext::Printf(output,"\n");
      uVar20 = uVar20 + 1;
    } while (uVar20 < (this->exRegVmCode).count);
  }
  if (withProfileInfo) {
    OutputContext::Printf(output,"\n");
    uVar20 = local_338;
    Var3 = (unkuint9)local_338;
    lVar6 = 0;
    do {
      uVar13 = (this->exRegVmInstructionExecCount).data[lVar6];
      if (uVar13 != 0) {
        pcVar8 = GetInstructionName((RegVmInstructionCode)lVar6);
        OutputContext::Printf
                  (output,"// %9s: %10d (%4.1f%%)\n",
                   (double)((float)uVar13 / (float)(unkint9)Var3) * 100.0,pcVar8,(ulong)uVar13);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
    OutputContext::Printf(output,"// %9s: %10lld (%4.0f%%)\n",0x4059000000000000,"total",uVar20);
  }
  if (output->outputBufPos != 0) {
    (*output->writeStream)(output->stream,output->outputBuf,output->outputBufPos);
  }
  output->outputBufPos = 0;
  SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::~SmallDenseMap
            (&regVmFunctionMap);
  SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::~SmallDenseSet(&regVmJumpTargetSet)
  ;
  NULLC::TraceScope::~TraceScope(&traceScope);
  return true;
}

Assistant:

bool Linker::SaveRegVmListing(OutputContext &output, bool withProfileInfo)
{
	TRACE_SCOPE("link", "SaveRegVmListing");

	unsigned line = 0, lastLine = ~0u;

	unsigned long long total = 0;

	if(withProfileInfo)
	{
		for(unsigned i = 0; i < 256; i++)
			total += exRegVmInstructionExecCount[i];
	}

	ExternSourceInfo *info = (ExternSourceInfo*)exRegVmSourceInfo.data;
	unsigned infoSize = exRegVmSourceInfo.size();

	SmallDenseSet<unsigned, SmallDenseMapUnsignedHasher, 32> regVmJumpTargetSet;

	for(unsigned i = 0; i < regVmJumpTargets.size(); i++)
		regVmJumpTargetSet.insert(regVmJumpTargets[i]);

	SmallDenseMap<unsigned, ExternFuncInfo*, SmallDenseMapUnsignedHasher, 32> regVmFunctionMap;

	for(unsigned i = 0; i < exFunctions.size(); i++)
		regVmFunctionMap.insert(exFunctions[i].regVmAddress, &exFunctions[i]);

	const char *lastSourcePos = exSource.data;
	const char *lastCodeStart = NULL;

	for(unsigned i = 0; infoSize && i < exRegVmCode.size(); i++)
	{
		while((line < infoSize - 1) && (i >= info[line + 1].instruction))
			line++;

		if(line != lastLine)
		{
			lastLine = line;

			const char *codeStart = exSource.data + info[line].sourceOffset;

			// Find beginning of the line
			while(codeStart != exSource.data && *(codeStart-1) != '\n')
				codeStart--;

			// Skip whitespace
			while(*codeStart == ' ' || *codeStart == '\t')
				codeStart++;

			const char *codeEnd = codeStart;
			while(*codeEnd != '\0' && *codeEnd != '\r' && *codeEnd != '\n')
				codeEnd++;

			if(codeEnd > lastSourcePos)
			{
				output.Printf("%.*s\r\n", int(codeEnd - lastSourcePos), lastSourcePos);
				lastSourcePos = codeEnd;
			}
			else
			{
				if(codeStart != lastCodeStart)
					output.Printf("%.*s\r\n", int(codeEnd - codeStart), codeStart);

				lastCodeStart = codeStart;
			}
		}

		RegVmCmd cmd = exRegVmCode[i];

		bool found = regVmJumpTargetSet.contains(i);

		if(ExternFuncInfo **func = regVmFunctionMap.find(i))
			output.Printf("// %s#%d\n", exSymbols.data + (*func)->offsetToName, unsigned(*func - exFunctions.data));

		if(withProfileInfo)
		{
			if(found)
			{
				output.Printf("//            %4d:\n", i);

				double percent = double(exRegVmExecCount[i]) / total * 100.0;

				if(percent > 0.1)
					output.Printf("// (%8d %4.1f)      ", exRegVmExecCount[i], percent);
				else
					output.Printf("// (%8d     )      ", exRegVmExecCount[i]);
			}
			else
			{
				double percent = double(exRegVmExecCount[i]) / total * 100.0;

				if(percent > 0.1)
					output.Printf("// (%8d %4.1f) %4d ", exRegVmExecCount[i], percent, i);
				else
					output.Printf("// (%8d     ) %4d ", exRegVmExecCount[i], i);
			}
		}
		else
		{
			if(found)
			{
				output.Printf("// %4d:\n", i);
				output.Printf("//      ");
			}
			else
			{
				output.Printf("// %4d ", i);
			}
		}

		PrintInstruction(output, (char*)exRegVmConstants.data, exFunctions.data, exSymbols.data, RegVmInstructionCode(cmd.code), cmd.rA, cmd.rB, cmd.rC, cmd.argument, NULL);

		if(cmd.code == rviCall || cmd.code == rviFuncAddr)
			output.Printf(" (%s)", exSymbols.data + exFunctions[exRegVmCode[i].argument].offsetToName);
		else if(cmd.code == rviConvertPtr)
			output.Printf(" (%s)", exSymbols.data + exTypes[exRegVmCode[i].argument].offsetToName);

		output.Printf("\n");
	}

	if(withProfileInfo)
	{
		output.Printf("\n");

		for(unsigned i = 0; i < 256; i++)
		{
			if(unsigned count = exRegVmInstructionExecCount[i])
				output.Printf("// %9s: %10d (%4.1f%%)\n", GetInstructionName(RegVmInstructionCode(i)), count, float(count) / total * 100.0);
		}

		output.Printf("// %9s: %10lld (%4.0f%%)\n", "total", total, 100.0);
	}

	output.Flush();

	return true;
}